

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

int skip_blank(char **pp,char *end)

{
  char cVar1;
  int in_EAX;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  pcVar3 = *pp;
  do {
    if (pcVar3 == end) {
LAB_001564a1:
      *pp = end;
      return 0x101;
    }
    cVar1 = *pcVar3;
    bVar4 = false;
    if ((cVar1 != '\t') && (cVar1 != ' ')) {
      if (cVar1 == ';') {
LAB_001563fa:
        pcVar2 = pcVar3 + 1;
        do {
          pcVar3 = pcVar2;
          if (pcVar3 == end) {
            bVar4 = false;
            pcVar3 = end;
            goto LAB_00156484;
          }
          pcVar2 = pcVar3 + 1;
        } while ((*pcVar3 != '\r') && (*pcVar3 != '\n'));
        if ((pcVar2 != end) && (*pcVar2 == '\n')) {
          pcVar3 = pcVar2;
        }
        *pp = pcVar3;
        bVar4 = true;
        in_EAX = 0x100;
      }
      else {
        if (cVar1 == '/') {
          if ((pcVar3 + 1 != end) && (pcVar3[1] == '/')) goto LAB_001563fa;
          bVar4 = false;
        }
        else {
          bVar4 = cVar1 == '\r' || cVar1 == '\n';
          if ((((cVar1 == '\r') || (cVar1 == '\n')) && (pcVar3 + 1 != end)) && (pcVar3[1] == '\n'))
          {
            pcVar3 = pcVar3 + 1;
          }
        }
        in_EAX = (int)cVar1;
        *pp = pcVar3;
        if (bVar4) {
          in_EAX = 0x100;
        }
        bVar4 = true;
      }
    }
LAB_00156484:
    if ((cVar1 != ' ') && (cVar1 != '\t')) {
      if (bVar4) {
        return in_EAX;
      }
      goto LAB_001564a1;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

static int skip_blank(const char** pp, const char* end)
{
	for (const char* p = *pp; p != end; ++p) {
		int c = *p;
		if (c == ' ' || c == '\t') {
			// skip whitespace
			continue;
		}
		if (c == ';' || (c == '/' && (p + 1) != end && *(p + 1) == '/')) {
			// skip comment
			for (++p;; ++p) {
				if (p == end)
					goto eof_reached;
				c = *p;
				if (is_eol(c)) {
					if ((p + 1) != end && *(p + 1) == '\n')
						p++;
					*pp = p;
					return IF_EOL;
				}
			}
		}
		if (is_eol(c) && (p + 1) != end && *(p + 1) == '\n')
			p++;
		*pp = p;
		return is_eol(c)? IF_EOL : c;
	}
eof_reached:
	*pp = end;
	return IF_EOF;
}